

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.h
# Opt level: O0

void __thiscall
midi_container::limit_port_number<unsigned_long>(midi_container *this,unsigned_long *number)

{
  ulong uVar1;
  size_type sVar2;
  byte *pbVar3;
  value_type local_1d;
  uint local_1c;
  unsigned_long *puStack_18;
  uint i;
  unsigned_long *number_local;
  midi_container *this_local;
  
  local_1c = 0;
  puStack_18 = number;
  number_local = (unsigned_long *)this;
  while( true ) {
    uVar1 = (ulong)local_1c;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_port_numbers);
    if (sVar2 <= uVar1) {
      local_1d = (value_type)*puStack_18;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->m_port_numbers,&local_1d);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_port_numbers);
      *puStack_18 = sVar2 - 1;
      return;
    }
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_port_numbers,(ulong)local_1c);
    if ((ulong)*pbVar3 == *puStack_18) break;
    local_1c = local_1c + 1;
  }
  *puStack_18 = (ulong)local_1c;
  return;
}

Assistant:

void limit_port_number(T & number)
    {
        for ( unsigned i = 0; i < m_port_numbers.size(); i++ )
        {
            if ( m_port_numbers[ i ] == number )
            {
                number = i;
                return;
            }
        }
        m_port_numbers.push_back( (const uint8_t) number );
        number = m_port_numbers.size() - 1;
    }